

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

void Saig_ManCexMinCollectReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vReason,int fPiReason)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t **ppAVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Aig_Obj_t **ppAVar7;
  uint uVar8;
  Aig_Obj_t *pAVar9;
  
  do {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar5 = uVar4 & 7;
    if (uVar5 == 3) {
      ppAVar7 = &pObj->pFanin0;
LAB_00487105:
      pAVar9 = *ppAVar7;
    }
    else {
      if (uVar5 == 2) {
        if (fPiReason == 0) {
          iVar3 = Saig_ObjIsLo(p,pObj);
          if (iVar3 == 0) {
            return;
          }
          iVar3 = Saig_ObjRegId(p,pObj);
        }
        else {
          iVar3 = Saig_ObjIsPi(p,pObj);
          if (iVar3 == 0) {
            return;
          }
          iVar3 = Aig_ObjCioId(pObj);
        }
        uVar4 = Abc_LitIsCompl((pObj->field_5).iData);
        iVar3 = Abc_Var2Lit(iVar3,uVar4 ^ 1);
        Vec_IntPush(vReason,iVar3);
        return;
      }
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
      }
      if (uVar5 == 1) {
        return;
      }
      if ((uVar4 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                      ,0x180,
                      "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                     );
      }
      iVar3 = Abc_LitIsCompl((pObj->field_5).iData);
      ppAVar1 = &pObj->pFanin0;
      uVar4 = Abc_LitIsCompl(*(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x28));
      uVar8 = *(uint *)&pObj->pFanin0 & 1;
      ppAVar2 = &pObj->pFanin1;
      uVar5 = Abc_LitIsCompl(*(int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x28));
      pAVar9 = pObj->pFanin1;
      uVar6 = (uint)pAVar9 & 1;
      if (iVar3 != 0) {
        if (uVar5 == uVar6 || uVar4 == uVar8) {
          __assert_fail("fPhase0 && fPhase1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                        ,0x185,
                        "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                       );
        }
        Saig_ManCexMinCollectReason_rec
                  (p,(Aig_Obj_t *)((ulong)*ppAVar1 & 0xfffffffffffffffe),vReason,fPiReason);
        ppAVar7 = ppAVar2;
        goto LAB_00487105;
      }
      if (uVar5 != uVar6 && uVar4 != uVar8) {
        __assert_fail("!fPhase0 || !fPhase1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                      ,0x18d,
                      "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                     );
      }
      if ((uVar4 == uVar8) && (ppAVar7 = ppAVar1, uVar5 != uVar6)) goto LAB_00487105;
      if ((uVar4 == uVar8) || (uVar5 != uVar6)) {
        uVar4 = Abc_Lit2Var(*(int *)(((ulong)*ppAVar1 & 0xfffffffffffffffe) + 0x28));
        uVar5 = Abc_Lit2Var(*(int *)(((ulong)*ppAVar2 & 0xfffffffffffffffe) + 0x28));
        ppAVar7 = ppAVar2;
        if (uVar5 <= uVar4) {
          ppAVar7 = ppAVar1;
        }
        goto LAB_00487105;
      }
    }
    pObj = (Aig_Obj_t *)((ulong)pAVar9 & 0xfffffffffffffffe);
  } while( true );
}

Assistant:

void Saig_ManCexMinCollectReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vReason, int fPiReason )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( fPiReason && Saig_ObjIsPi(p, pObj) )
            Vec_IntPush( vReason, Abc_Var2Lit( Aig_ObjCioId(pObj), !Abc_LitIsCompl(pObj->iData) ) );
        else if ( !fPiReason && Saig_ObjIsLo(p, pObj) )
            Vec_IntPush( vReason, Abc_Var2Lit( Saig_ObjRegId(p, pObj), !Abc_LitIsCompl(pObj->iData) ) );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        return;
    }
    if ( Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    if ( Abc_LitIsCompl(pObj->iData) ) // value 1
    {
        int fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        int fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        assert( fPhase0 && fPhase1 );
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
    }
    else
    {
        int fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        int fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        else if ( fPhase0 && !fPhase1 )
            Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
        else 
        {
            int iPrio0 = Abc_Lit2Var( Aig_ObjFanin0(pObj)->iData );
            int iPrio1 = Abc_Lit2Var( Aig_ObjFanin1(pObj)->iData );
            if ( iPrio0 >= iPrio1 )
                Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
            else
                Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
        }
    }
}